

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O2

void gen_spr_BookE206(CPUPPCState_conflict2 *env,uint32_t mas_mask,uint32_t *tlbncfg,uint32_t mmucfg
                     )

{
  code *oea_write;
  uint uVar1;
  long lVar2;
  
  uVar1 = 0;
  for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 4) {
    oea_write = spr_write_generic32;
    if ((lVar2 == 8 && (mas_mask & 4) != 0) &&
       (oea_write = spr_write_generic, (env->insns_flags & 0x20) == 0)) {
      oea_write = spr_write_generic32;
    }
    if ((mas_mask >> (uVar1 & 0x1f) & 1) != 0) {
      _spr_register(env,*(int *)((long)&DAT_00bbc160 + lVar2),
                    (char *)((long)&DAT_00bc1b40 + (long)*(int *)((long)&DAT_00bc1b40 + lVar2)),
                    spr_noaccess,spr_noaccess,spr_read_generic,oea_write,spr_read_generic,oea_write,
                    0);
    }
    uVar1 = uVar1 + 1;
  }
  if ((1 < env->nb_pids) &&
     (_spr_register(env,0x279,"PID1",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_booke_pid,
                    spr_read_generic,spr_write_booke_pid,0), 2 < env->nb_pids)) {
    _spr_register(env,0x27a,"PID2",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_booke_pid,
                  spr_read_generic,spr_write_booke_pid,0);
  }
  _spr_register(env,0x3b3,"EPLC",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_eplc,
                spr_read_generic,spr_write_eplc,0);
  _spr_register(env,0x3b4,"EPSC",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_epsc,
                spr_read_generic,spr_write_epsc,0);
  _spr_register(env,0x3f7,"MMUCFG",spr_noaccess,spr_noaccess,spr_read_generic,spr_noaccess,
                spr_read_generic,spr_noaccess,(ulong)mmucfg);
  switch(env->nb_ways) {
  case 4:
    _spr_register(env,0x2b3,"TLB3CFG",spr_noaccess,spr_noaccess,spr_read_generic,spr_noaccess,
                  spr_read_generic,spr_noaccess,(ulong)tlbncfg[3]);
  case 3:
    _spr_register(env,0x2b2,"TLB2CFG",spr_noaccess,spr_noaccess,spr_read_generic,spr_noaccess,
                  spr_read_generic,spr_noaccess,(ulong)tlbncfg[2]);
  case 2:
    _spr_register(env,0x2b1,"TLB1CFG",spr_noaccess,spr_noaccess,spr_read_generic,spr_noaccess,
                  spr_read_generic,spr_noaccess,(ulong)tlbncfg[1]);
  case 1:
    _spr_register(env,0x2b0,"TLB0CFG",spr_noaccess,spr_noaccess,spr_read_generic,spr_noaccess,
                  spr_read_generic,spr_noaccess,(ulong)*tlbncfg);
  default:
    gen_spr_usprgh(env);
    return;
  }
}

Assistant:

static void gen_spr_BookE206(CPUPPCState *env, uint32_t mas_mask,
                             uint32_t *tlbncfg, uint32_t mmucfg)
{
    const char *mas_names[8] = {
        "MAS0", "MAS1", "MAS2", "MAS3", "MAS4", "MAS5", "MAS6", "MAS7",
    };
    int mas_sprn[8] = {
        SPR_BOOKE_MAS0, SPR_BOOKE_MAS1, SPR_BOOKE_MAS2, SPR_BOOKE_MAS3,
        SPR_BOOKE_MAS4, SPR_BOOKE_MAS5, SPR_BOOKE_MAS6, SPR_BOOKE_MAS7,
    };
    int i;

    /* TLB assist registers */
    /* XXX : not implemented */
    for (i = 0; i < 8; i++) {
        void (*uea_write)(DisasContext *ctx, int sprn, int gprn) =
            &spr_write_generic32;
        if (i == 2 && (mas_mask & (1 << i)) && (env->insns_flags & PPC_64B)) {
            uea_write = &spr_write_generic;
        }
        if (mas_mask & (1 << i)) {
            spr_register(env, mas_sprn[i], mas_names[i],
                         SPR_NOACCESS, SPR_NOACCESS,
                         &spr_read_generic, uea_write,
                         0x00000000);
        }
    }
    if (env->nb_pids > 1) {
        /* XXX : not implemented */
        spr_register(env, SPR_BOOKE_PID1, "PID1",
                     SPR_NOACCESS, SPR_NOACCESS,
                     &spr_read_generic, &spr_write_booke_pid,
                     0x00000000);
    }
    if (env->nb_pids > 2) {
        /* XXX : not implemented */
        spr_register(env, SPR_BOOKE_PID2, "PID2",
                     SPR_NOACCESS, SPR_NOACCESS,
                     &spr_read_generic, &spr_write_booke_pid,
                     0x00000000);
    }

    spr_register(env, SPR_BOOKE_EPLC, "EPLC",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_eplc,
                 0x00000000);
    spr_register(env, SPR_BOOKE_EPSC, "EPSC",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_epsc,
                 0x00000000);

    /* XXX : not implemented */
    spr_register(env, SPR_MMUCFG, "MMUCFG",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, SPR_NOACCESS,
                 mmucfg);
    switch (env->nb_ways) {
    case 4:
        spr_register(env, SPR_BOOKE_TLB3CFG, "TLB3CFG",
                     SPR_NOACCESS, SPR_NOACCESS,
                     &spr_read_generic, SPR_NOACCESS,
                     tlbncfg[3]);
        /* Fallthru */
    case 3:
        spr_register(env, SPR_BOOKE_TLB2CFG, "TLB2CFG",
                     SPR_NOACCESS, SPR_NOACCESS,
                     &spr_read_generic, SPR_NOACCESS,
                     tlbncfg[2]);
        /* Fallthru */
    case 2:
        spr_register(env, SPR_BOOKE_TLB1CFG, "TLB1CFG",
                     SPR_NOACCESS, SPR_NOACCESS,
                     &spr_read_generic, SPR_NOACCESS,
                     tlbncfg[1]);
        /* Fallthru */
    case 1:
        spr_register(env, SPR_BOOKE_TLB0CFG, "TLB0CFG",
                     SPR_NOACCESS, SPR_NOACCESS,
                     &spr_read_generic, SPR_NOACCESS,
                     tlbncfg[0]);
        /* Fallthru */
    case 0:
    default:
        break;
    }

    gen_spr_usprgh(env);
}